

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargeting444CBRScreenTest
          (DatarateTestLarge *this)

{
  undefined1 uVar1;
  bool bVar2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  Message *pMVar4;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  Y4mVideoSource video;
  char (*in_stack_fffffffffffffde8) [59];
  Y4mVideoSource *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  int iVar5;
  char *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  Type type;
  uint in_stack_fffffffffffffe20;
  uint uVar6;
  undefined2 in_stack_fffffffffffffe24;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Message *in_stack_fffffffffffffe68;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe70;
  AssertionResult local_168 [2];
  uint local_144;
  HasNewFatalFailureHelper local_140;
  undefined8 local_128;
  aom_rational_t local_11c;
  allocator local_101;
  string local_100 [32];
  Y4mVideoSource local_e0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"rush_hour_444.y4m",&local_101);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            ((Y4mVideoSource *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,
                               CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))),
             in_stack_fffffffffffffe18,(uint)((ulong)in_stack_fffffffffffffe10 >> 0x20),
             (int)in_stack_fffffffffffffe10);
  type = (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  *(undefined4 *)(in_RDI + 0x38) = 1;
  local_11c = libaom_test::Y4mVideoSource::timebase(&local_e0);
  *(aom_rational_t *)(in_RDI + 0x58) = local_11c;
  *(undefined4 *)(in_RDI + 0xd0) = 500;
  *(undefined4 *)(in_RDI + 0xd4) = 500;
  *(undefined4 *)(in_RDI + 0xcc) = 1000;
  *(undefined4 *)(in_RDI + 0x6c) = 1;
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0x3f;
  *(undefined4 *)(in_RDI + 0x90) = 1;
  local_128 = 0x28a000000fa;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x78643a);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)((long)&local_128 + (long)*p_Var3 * 4);
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x98))(in_RDI + 0x18);
  *(undefined1 *)(in_RDI + 0x461) = 1;
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                       CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                                      )));
    in_stack_fffffffffffffe26 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe26) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,&local_e0);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_140);
    if (bVar2) {
      local_144 = 2;
    }
    else {
      local_144 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffdf0);
    if (local_144 == 0) {
      uVar6 = local_144;
      testing::internal::CmpHelperGE<double,double>
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (double *)in_stack_fffffffffffffdf0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_168);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)
                   CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                           CONCAT24(in_stack_fffffffffffffe24,uVar6))));
        pMVar4 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        type = (Type)((ulong)pMVar4 >> 0x20);
        in_stack_fffffffffffffe10 =
             testing::AssertionResult::failure_message((AssertionResult *)0x786732);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                           CONCAT24(in_stack_fffffffffffffe24,uVar6))),type,
                   in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                   in_stack_fffffffffffffe00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe70._M_head_impl,in_stack_fffffffffffffe68)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
        testing::Message::~Message((Message *)0x78678c);
      }
      local_144 = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x786813);
      if (local_144 == 0) {
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                   (double *)in_stack_fffffffffffffdf0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffe68);
        if (!bVar2) {
          testing::Message::Message
                    ((Message *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                             CONCAT24(in_stack_fffffffffffffe24,uVar6))));
          pMVar4 = testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffffdf0,
                              (char (*) [46])in_stack_fffffffffffffde8);
          iVar5 = (int)((ulong)pMVar4 >> 0x20);
          pMVar4 = testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffffdf0,(uint *)in_stack_fffffffffffffde8
                             );
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffdf0,(char (*) [2])in_stack_fffffffffffffde8);
          in_stack_fffffffffffffdf0 =
               (Y4mVideoSource *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffdf0,(double *)in_stack_fffffffffffffde8);
          testing::AssertionResult::failure_message((AssertionResult *)0x786928);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                             CONCAT24(in_stack_fffffffffffffe24,uVar6))),type,
                     in_stack_fffffffffffffe10,iVar5,(char *)pMVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe70._M_head_impl,
                     in_stack_fffffffffffffe68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
          testing::Message::~Message((Message *)0x786974);
        }
        local_144 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7869f2);
        if (local_144 == 0) {
          local_144 = 0;
        }
      }
      goto LAB_00786a0a;
    }
    in_stack_fffffffffffffe20 = local_144;
    if (local_144 != 2) goto LAB_00786a0a;
  }
  iVar5 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  testing::Message::Message
            ((Message *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)))
            );
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)))
             ,type,in_stack_fffffffffffffe10,iVar5,in_stack_fffffffffffffe00);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffe70._M_head_impl,in_stack_fffffffffffffe68);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
  testing::Message::~Message((Message *)0x786627);
  local_144 = 1;
LAB_00786a0a:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(in_stack_fffffffffffffdf0);
  return;
}

Assistant:

virtual void BasicRateTargeting444CBRScreenTest() {
    ::libaom_test::Y4mVideoSource video("rush_hour_444.y4m", 0, 140);

    cfg_.g_profile = 1;
    cfg_.g_timebase = video.timebase();

    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 1;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;

    const int bitrate_array[2] = { 250, 650 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    screen_mode_ = true;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 0.85)
        << " The datarate for the file exceeds the target by too much!";
    ASSERT_LE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 1.15)
        << " The datarate for the file missed the target!"
        << cfg_.rc_target_bitrate << " " << effective_datarate_;
  }